

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O1

int vkt::tessellation::referenceTriangleNonPointModePrimitiveCount
              (SpacingMode spacingMode,int inner,int outer0,int outer1,int outer2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  while( true ) {
    if (inner != 1) {
      iVar1 = outer1 + outer0 + outer2;
      if (1 < inner) {
        iVar2 = inner / 2;
        iVar3 = inner * 6;
        iVar4 = inner - 3;
        do {
          iVar3 = iVar3 + -0xc;
          iVar5 = iVar3;
          if (iVar4 == 0) {
            iVar5 = 4;
          }
          iVar1 = iVar1 + iVar5;
          iVar4 = iVar4 + -2;
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      return iVar1;
    }
    if ((outer1 == 1 && outer0 == 1) && outer2 == 1) break;
    inner = spacingMode == SPACINGMODE_FRACTIONAL_ODD | 2;
  }
  return 1;
}

Assistant:

static int referenceTriangleNonPointModePrimitiveCount (const SpacingMode spacingMode, const int inner, const int outer0, const int outer1, const int outer2)
{
	if (inner == 1)
	{
		if (outer0 == 1 && outer1 == 1 && outer2 == 1)
			return 1;
		else
			return referenceTriangleNonPointModePrimitiveCount(spacingMode, spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
																			outer0, outer1, outer2);
	}
	else
	{
		int result = outer0 + outer1 + outer2;

		const int numInnerTriangles = inner/2;
		for (int innerTriangleNdx = 0; innerTriangleNdx < numInnerTriangles; innerTriangleNdx++)
		{
			const int curInnerTriangleLevel = inner - 2*(innerTriangleNdx+1);

			if (curInnerTriangleLevel == 1)
				result += 4;
			else
				result += 2*3*curInnerTriangleLevel;
		}

		return result;
	}
}